

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_set_outgoing_window(SESSION_HANDLE session,uint32_t outgoing_window)

{
  SESSION_INSTANCE *session_instance;
  int result;
  uint32_t outgoing_window_local;
  SESSION_HANDLE session_local;
  
  if (session == (SESSION_HANDLE)0x0) {
    session_instance._0_4_ = 0x3fc;
  }
  else {
    session->outgoing_window = outgoing_window;
    session_instance._0_4_ = 0;
  }
  return (int)session_instance;
}

Assistant:

int session_set_outgoing_window(SESSION_HANDLE session, uint32_t outgoing_window)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_instance->outgoing_window = outgoing_window;

        result = 0;
    }

    return result;
}